

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

string * __thiscall
cmdline::parser::option_with_value<int>::full_description
          (string *__return_storage_ptr__,option_with_value<int> *this,string *desc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_78,desc," (");
  detail::readable_typename<int>();
  std::operator+(&local_58,&local_78,&local_98);
  bVar1 = this->need;
  if (bVar1 == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)&bStack_f8);
  }
  else {
    detail::
    lexical_cast_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_false>
    ::cast(&local_b8,&this->def);
    std::operator+(&bStack_f8," [=",&local_b8);
    std::operator+(&local_d8,&bStack_f8,"]");
  }
  std::operator+(&local_38,&local_58,&local_d8);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar1 == false) {
    std::__cxx11::string::~string((string *)&bStack_f8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string& desc) {
            return desc + " (" + detail::readable_typename<T>() +
                   (need ? "" : " [=" + detail::lexical_cast<std::string>(def) + "]") + ")";
        }